

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O0

void Sbd_ProblemPrintSolution(int nStrs,Sbd_Str_t *pStr0,Vec_Int_t *vLits)

{
  int iVar1;
  char *pcVar2;
  int local_38;
  int local_34;
  int iLit;
  int nIters;
  int m;
  Sbd_Str_t *pStr;
  Vec_Int_t *vLits_local;
  Sbd_Str_t *pStr0_local;
  int nStrs_local;
  
  local_34 = 0;
  printf("Solution found:\n");
  for (_nIters = pStr0; _nIters < pStr0 + nStrs; _nIters = _nIters + 1) {
    if (_nIters->fLut == 0) {
      local_38 = _nIters->nVarIns;
    }
    else {
      local_38 = 1 << ((byte)_nIters->nVarIns & 0x1f);
    }
    pcVar2 = "SEL";
    if (_nIters->fLut != 0) {
      pcVar2 = "LUT";
    }
    printf("%s%d : ",pcVar2,((long)_nIters - (long)pStr0) / 0x38 & 0xffffffff);
    for (iLit = 0; iLit < local_38; iLit = iLit + 1) {
      iVar1 = Vec_IntEntry(vLits,local_34);
      iVar1 = Abc_LitIsCompl(iVar1);
      printf("%d",(ulong)((iVar1 != 0 ^ 0xffU) & 1));
      local_34 = local_34 + 1;
    }
    printf("    {");
    for (iLit = 0; iLit < _nIters->nVarIns; iLit = iLit + 1) {
      printf(" %d",(ulong)(uint)_nIters->VarIns[iLit]);
    }
    printf(" }\n");
  }
  iVar1 = Vec_IntSize(vLits);
  if (local_34 == iVar1) {
    return;
  }
  __assert_fail("iLit == Vec_IntSize(vLits)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                ,0x90,"void Sbd_ProblemPrintSolution(int, Sbd_Str_t *, Vec_Int_t *)");
}

Assistant:

void Sbd_ProblemPrintSolution( int nStrs, Sbd_Str_t * pStr0, Vec_Int_t * vLits )
{
    Sbd_Str_t * pStr;
    int m, nIters, iLit = 0;
    printf( "Solution found:\n" );
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++ )
    {
        nIters = pStr->fLut ? 1 << pStr->nVarIns : pStr->nVarIns;
        printf( "%s%d : ", pStr->fLut ? "LUT":"SEL", (int)(pStr-pStr0) );
        for ( m = 0; m < nIters; m++, iLit++ )
            printf( "%d", !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) );
        printf( "    {" );
        for ( m = 0; m < pStr->nVarIns; m++ )
            printf( " %d", pStr->VarIns[m] );
        printf( " }\n" );
    }
    assert( iLit == Vec_IntSize(vLits) );
}